

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall cmExportFileGenerator::SetExportFile(cmExportFileGenerator *this,char *mainFile)

{
  string *filename;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  string local_40;
  
  filename = &this->MainImportFile;
  pcVar2 = (char *)(this->MainImportFile)._M_string_length;
  strlen(mainFile);
  std::__cxx11::string::_M_replace((ulong)filename,0,pcVar2,(ulong)mainFile);
  cmsys::SystemTools::GetFilenamePath(&local_40,filename);
  std::__cxx11::string::operator=((string *)&this->FileDir,(string *)&local_40);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_40,filename);
  std::__cxx11::string::operator=((string *)&this->FileBase,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetFilenameLastExtension(&local_40,filename);
  std::__cxx11::string::operator=((string *)&this->FileExt,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetExportFile(const char* mainFile)
{
  this->MainImportFile = mainFile;
  this->FileDir = cmSystemTools::GetFilenamePath(this->MainImportFile);
  this->FileBase =
    cmSystemTools::GetFilenameWithoutLastExtension(this->MainImportFile);
  this->FileExt =
    cmSystemTools::GetFilenameLastExtension(this->MainImportFile);
}